

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O1

tokens __thiscall Ident::Tk(Ident *this,bool isStrictMode)

{
  tokens tVar1;
  
  tVar1 = (tokens)this->m_tk;
  if (this->m_tk != 0) {
    if (tVar1 == tkLim) {
      this->m_tk = 0;
      tVar1 = TkFromNameLen(this->m_luHash,(LPCOLESTR)&this->field_0x22,this->m_cch,isStrictMode,
                            &this->m_grfid,&this->m_tk);
      return tVar1;
    }
    if ((this->m_grfid & 1) != 0) {
      return tVar1;
    }
  }
  if (!isStrictMode) {
    return tkID;
  }
  if ((this->m_grfid & 2) != 0) {
    return tVar1;
  }
  return tkID;
}

Assistant:

tokens Ident::Tk(bool isStrictMode)
{
    const tokens token = (tokens)m_tk;
    if (token == tkLim)
    {
        m_tk = tkNone;
        const uint32 luHash = this->m_luHash;
        const LPCOLESTR prgch = Psz();
        const uint32 cch = Cch();

        return TkFromNameLen(luHash, prgch, cch, isStrictMode, &this->m_grfid, &this->m_tk);
    }
    else if (token == tkNone || !(m_grfid & fidKwdRsvd))
    {
        if ( !isStrictMode || !(m_grfid & fidKwdFutRsvd))
        {
            return tkID;
        }
    }
    return token;
}